

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodings.h
# Opt level: O1

bool rapidjson::UTF8<char>::
     Validate<rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>::PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>>
               (GenericStringStream<rapidjson::UTF8<char>_> *is,
               PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
               *os)

{
  byte *pbVar1;
  char *pcVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  
  pbVar1 = (byte *)is->src_;
  is->src_ = (Ch *)(pbVar1 + 1);
  bVar3 = *pbVar1;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::
  PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
  ::Put(os,bVar3);
  if (-1 < (char)bVar3) {
    return true;
  }
  switch(GetRange(unsigned_char)::type[bVar3]) {
  case 2:
    pcVar2 = is->src_;
    is->src_ = pcVar2 + 1;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::
    PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
    ::Put(os,*pcVar2);
    return false;
  case 3:
    pbVar1 = (byte *)is->src_;
    is->src_ = (Ch *)(pbVar1 + 1);
    bVar3 = *pbVar1;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::
    PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
    ::Put(os,bVar3);
    bVar4 = bVar3 & 0xc0;
    goto LAB_001284b7;
  case 4:
    pbVar1 = (byte *)is->src_;
    is->src_ = (Ch *)(pbVar1 + 1);
    bVar3 = *pbVar1;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::
    PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
    ::Put(os,bVar3);
    bVar4 = bVar3 & 0xe0;
LAB_001284b7:
    if (bVar3 != 0) {
      pbVar1 = (byte *)is->src_;
      is->src_ = (Ch *)(pbVar1 + 1);
      bVar3 = *pbVar1;
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::
      PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
      ::Put(os,bVar3);
    }
    bVar3 = (bVar3 & 0xc0) + 0x80;
LAB_001284e0:
    return bVar3 == 0 && bVar4 == 0x80;
  case 5:
    pcVar2 = is->src_;
    is->src_ = pcVar2 + 1;
    cVar5 = *pcVar2;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::
    PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
    ::Put(os,cVar5);
    if (cVar5 != '\0') {
      pcVar2 = is->src_;
      is->src_ = pcVar2 + 1;
      cVar5 = *pcVar2;
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::
      PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
      ::Put(os,cVar5);
    }
    if (cVar5 != '\0') {
      pcVar2 = is->src_;
      is->src_ = pcVar2 + 1;
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::
      PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
      ::Put(os,*pcVar2);
    }
    break;
  case 6:
    pcVar2 = is->src_;
    is->src_ = pcVar2 + 1;
    cVar5 = *pcVar2;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::
    PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
    ::Put(os,cVar5);
    if (cVar5 != '\0') {
      pcVar2 = is->src_;
      is->src_ = pcVar2 + 1;
      cVar5 = *pcVar2;
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::
      PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
      ::Put(os,cVar5);
    }
    if (cVar5 != '\0') {
      pcVar2 = is->src_;
      is->src_ = pcVar2 + 1;
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::
      PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
      ::Put(os,*pcVar2);
    }
    break;
  case 10:
    pbVar1 = (byte *)is->src_;
    is->src_ = (Ch *)(pbVar1 + 1);
    bVar3 = *pbVar1;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::
    PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
    ::Put(os,bVar3);
    bVar4 = bVar3;
    if (bVar3 != 0) {
      pbVar1 = (byte *)is->src_;
      is->src_ = (Ch *)(pbVar1 + 1);
      bVar4 = *pbVar1;
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::
      PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
      ::Put(os,bVar4);
    }
    bVar4 = bVar4 & 0xc0;
    bVar3 = bVar3 & 0xe0 ^ 0xa0;
    goto LAB_001284e0;
  case 0xb:
    pcVar2 = is->src_;
    is->src_ = pcVar2 + 1;
    cVar5 = *pcVar2;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::
    PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
    ::Put(os,cVar5);
    if (cVar5 != '\0') {
      pcVar2 = is->src_;
      is->src_ = pcVar2 + 1;
      cVar5 = *pcVar2;
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::
      PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
      ::Put(os,cVar5);
    }
    if (cVar5 != '\0') {
      pcVar2 = is->src_;
      is->src_ = pcVar2 + 1;
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::
      PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
      ::Put(os,*pcVar2);
    }
  }
  return false;
}

Assistant:

static bool Validate(InputStream& is, OutputStream& os) {
#define RAPIDJSON_COPY() if (c != '\0') os.Put(c = is.Take())
#define RAPIDJSON_TRANS(mask) result &= ((GetRange(static_cast<unsigned char>(c)) & mask) != 0)
#define RAPIDJSON_TAIL() RAPIDJSON_COPY(); RAPIDJSON_TRANS(0x70)
        Ch c = static_cast<Ch>(-1);
        RAPIDJSON_COPY();
        if (!(c & 0x80))
            return true;

        bool result = true;
        switch (GetRange(static_cast<unsigned char>(c))) {
        case 2: RAPIDJSON_TAIL(); return result;
        case 3: RAPIDJSON_TAIL(); RAPIDJSON_TAIL(); return result;
        case 4: RAPIDJSON_COPY(); RAPIDJSON_TRANS(0x50); RAPIDJSON_TAIL(); return result;
        case 5: RAPIDJSON_COPY(); RAPIDJSON_TRANS(0x10); RAPIDJSON_TAIL(); RAPIDJSON_TAIL(); return result;
        case 6: RAPIDJSON_TAIL(); RAPIDJSON_TAIL(); RAPIDJSON_TAIL(); return result;
        case 10: RAPIDJSON_COPY(); RAPIDJSON_TRANS(0x20); RAPIDJSON_TAIL(); return result;
        case 11: RAPIDJSON_COPY(); RAPIDJSON_TRANS(0x60); RAPIDJSON_TAIL(); RAPIDJSON_TAIL(); return result;
        default: return false;
        }
#undef RAPIDJSON_COPY
#undef RAPIDJSON_TRANS
#undef RAPIDJSON_TAIL
    }